

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<8> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  extended_range<unsigned_long> *range;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  Vec3fa VVar4;
  undefined4 uVar5;
  ThreadLocal2 *pTVar6;
  iterator __position;
  ThreadLocal2 *pTVar7;
  undefined8 uVar8;
  unsigned_long uVar9;
  size_t i_2;
  ulong uVar10;
  long lVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar12;
  NodeRefPtr<8> NVar13;
  size_t sVar14;
  undefined8 *puVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  size_t i_1;
  ulong uVar21;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *current_00;
  undefined1 auVar22 [32];
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  ThreadLocal2 *local_838;
  ThreadLocal2 *local_830;
  ThreadLocal2 *local_828;
  bool local_820;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_818;
  undefined4 local_808;
  undefined4 uStack_804;
  undefined4 uStack_800;
  undefined4 uStack_7fc;
  undefined4 local_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 local_7e8;
  undefined4 uStack_7e4;
  undefined4 uStack_7e0;
  undefined4 uStack_7dc;
  unsigned_long local_7d8;
  unsigned_long uStack_7d0;
  unsigned_long local_7c8;
  ThreadLocal2 *local_7a8;
  bool local_7a0 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_798;
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_778;
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  unsigned_long local_758 [4];
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_738 [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_738[0].depth = (size_t)&local_738[0].prims;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"depth limit reached","");
    *puVar15 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar15 + 1) = 1;
    puVar15[2] = puVar15 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 2),local_738[0].depth,
               (long)&(((CentGeomBBox3fa *)local_738[0].depth)->geomBounds).lower.field_0 +
               CONCAT71(local_738[0]._9_7_,local_738[0].alloc_barrier));
    __cxa_throw(puVar15,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  range = &(current->prims).super_extended_range<unsigned_long>;
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar13 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>
                           *)this->createLeaf,this->prims,&range->super_range<unsigned_long>,alloc);
    return (NodeRefPtr<8>)NVar13.ptr;
  }
  local_738[0].alloc_barrier = current->alloc_barrier;
  local_738[0].depth = current->depth;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0 + 8);
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
       (range->super_range<unsigned_long>)._begin;
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
       (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  local_738[0].prims.super_extended_range<unsigned_long>._ext_end =
       (current->prims).super_extended_range<unsigned_long>._ext_end;
  uVar21 = 1;
  do {
    uVar10 = 0xffffffffffffffff;
    puVar16 = &local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar17 = 0;
    uVar18 = 0;
    do {
      uVar19 = *puVar16 - ((range<unsigned_long> *)(puVar16 + -1))->_begin;
      if (((this->cfg).maxLeafSize < uVar19) && (uVar18 < uVar19)) {
        uVar10 = uVar17;
        uVar18 = uVar19;
      }
      uVar17 = uVar17 + 1;
      puVar16 = puVar16 + 0xe;
    } while (uVar21 != uVar17);
    if (uVar10 == 0xffffffffffffffff) break;
    local_828 = (ThreadLocal2 *)(current->depth + 1);
    local_820 = false;
    local_818.m128[0] = INFINITY;
    local_818.m128[1] = INFINITY;
    local_818.m128[2] = INFINITY;
    local_818.m128[3] = INFINITY;
    local_808 = 0xff800000;
    uStack_804 = 0xff800000;
    uStack_800 = 0xff800000;
    uStack_7fc = 0xff800000;
    local_7f8 = 0x7f800000;
    uStack_7f4 = 0x7f800000;
    uStack_7f0 = 0x7f800000;
    uStack_7ec = 0x7f800000;
    local_7e8 = 0xff800000;
    uStack_7e4 = 0xff800000;
    uStack_7e0 = 0xff800000;
    uStack_7dc = 0xff800000;
    local_7c8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7a0[0] = false;
    local_798.m128[0] = INFINITY;
    local_798.m128[1] = INFINITY;
    local_798.m128[2] = INFINITY;
    local_798.m128[3] = INFINITY;
    local_788 = 0xff800000;
    uStack_784 = 0xff800000;
    uStack_780 = 0xff800000;
    uStack_77c = 0xff800000;
    local_778.m128[0] = INFINITY;
    local_778.m128[1] = INFINITY;
    local_778.m128[2] = INFINITY;
    local_778.m128[3] = INFINITY;
    local_768 = 0xff800000;
    uStack_764 = 0xff800000;
    uStack_760 = 0xff800000;
    uStack_75c = 0xff800000;
    local_758[2] = 0;
    local_758[0] = 0;
    local_758[1] = 0;
    local_7a8 = local_828;
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&local_738[uVar10].prims,(PrimInfoExtRange *)&local_818.field_1,
                  (PrimInfoExtRange *)&local_798.field_1);
    lVar11 = uVar21 * 0x70;
    local_738[uVar10].alloc_barrier = local_7a0[lVar11];
    local_738[uVar10].depth = *(size_t *)(local_7a0 + lVar11 + -8);
    uVar8 = *(undefined8 *)((long)&local_798 + lVar11 + 8);
    *(undefined8 *)&local_738[uVar10].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         *(undefined8 *)(&local_798 + uVar21 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar10].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) = uVar8;
    uVar8 = *(undefined8 *)(&uStack_780 + uVar21 * 0x1c);
    *(undefined8 *)&local_738[uVar10].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         *(undefined8 *)(&local_788 + uVar21 * 0x1c);
    *(undefined8 *)
     ((long)&local_738[uVar10].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) = uVar8;
    uVar8 = *(undefined8 *)((long)&local_778 + lVar11 + 8);
    *(undefined8 *)&local_738[uVar10].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         *(undefined8 *)(&local_778 + uVar21 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar10].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) = uVar8;
    uVar9 = local_758[uVar21 * 0xe + -1];
    *(undefined8 *)&local_738[uVar10].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         *(undefined8 *)(&local_768 + uVar21 * 0x1c);
    *(unsigned_long *)
     ((long)&local_738[uVar10].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) = uVar9;
    uVar9 = local_738[uVar21 - 1].prims.super_extended_range<unsigned_long>.
            super_range<unsigned_long>._end;
    local_738[uVar10].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_758[uVar21 * 0xe];
    local_738[uVar10].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uVar9;
    local_738[uVar10].prims.super_extended_range<unsigned_long>._ext_end =
         local_738[uVar21 - 1].prims.super_extended_range<unsigned_long>._ext_end;
    *(ThreadLocal2 **)(local_7a0 + lVar11 + -8) = local_828;
    local_7a0[lVar11] = local_820;
    *(ulong *)(&local_798 + uVar21 * 7) = CONCAT44(local_818.m128[1],local_818.m128[0]);
    *(ulong *)((long)&local_798 + lVar11 + 8) = CONCAT44(local_818.m128[3],local_818.m128[2]);
    *(ulong *)(&local_788 + uVar21 * 0x1c) = CONCAT44(uStack_804,local_808);
    *(ulong *)(&uStack_780 + uVar21 * 0x1c) = CONCAT44(uStack_7fc,uStack_800);
    *(ulong *)(&local_778 + uVar21 * 7) = CONCAT44(uStack_7f4,local_7f8);
    *(ulong *)((long)&local_778 + lVar11 + 8) = CONCAT44(uStack_7ec,uStack_7f0);
    *(ulong *)(&local_768 + uVar21 * 0x1c) = CONCAT44(uStack_7e4,local_7e8);
    local_758[uVar21 * 0xe + -1] = CONCAT44(uStack_7dc,uStack_7e0);
    local_738[uVar21 - 1].prims.super_extended_range<unsigned_long>._ext_end = local_7c8;
    local_758[uVar21 * 0xe] = local_7d8;
    local_738[uVar21 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
         = uStack_7d0;
    local_738[uVar21].alloc_barrier = local_7a0[0];
    local_738[uVar21].depth = (size_t)local_7a8;
    *(ulong *)&local_738[uVar21].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         CONCAT44(local_798.m128[1],local_798.m128[0]);
    *(ulong *)((long)&local_738[uVar21].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) =
         CONCAT44(local_798.m128[3],local_798.m128[2]);
    *(ulong *)&local_738[uVar21].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         CONCAT44(uStack_784,local_788);
    *(ulong *)((long)&local_738[uVar21].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) =
         CONCAT44(uStack_77c,uStack_780);
    *(ulong *)&local_738[uVar21].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         CONCAT44(local_778.m128[1],local_778.m128[0]);
    *(ulong *)((long)&local_738[uVar21].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) =
         CONCAT44(local_778.m128[3],local_778.m128[2]);
    *(ulong *)&local_738[uVar21].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         CONCAT44(uStack_764,local_768);
    *(ulong *)((long)&local_738[uVar21].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) =
         CONCAT44(uStack_75c,uStack_760);
    local_738[uVar21].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_758[0];
    local_738[uVar21].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         local_758[1];
    local_738[uVar21].prims.super_extended_range<unsigned_long>._ext_end = local_758[2];
    uVar21 = uVar21 + 1;
  } while (uVar21 < (this->cfg).branchingFactor);
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<8>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  local_838 = (ThreadLocal2 *)0x100;
  pTVar6 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar6->alloc)._M_b._M_p) {
    local_7a0[0] = true;
    local_7a8 = pTVar6;
    MutexSys::lock(&pTVar6->mutex);
    if ((pTVar6->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesUsed + (pTVar6->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar6->alloc0).end + (pTVar6->alloc1).end) -
           ((pTVar6->alloc0).cur + (pTVar6->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar6->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar6->alloc1).bytesWasted + (pTVar6->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar6->alloc0).end = auVar22._0_8_;
    (pTVar6->alloc0).allocBlockSize = auVar22._8_8_;
    (pTVar6->alloc0).bytesUsed = auVar22._16_8_;
    (pTVar6->alloc0).bytesWasted = auVar22._24_8_;
    (pTVar6->alloc0).ptr = (char *)auVar22._0_8_;
    (pTVar6->alloc0).cur = auVar22._8_8_;
    (pTVar6->alloc0).end = auVar22._16_8_;
    (pTVar6->alloc0).allocBlockSize = auVar22._24_8_;
    auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar6->alloc1).end = auVar22._0_8_;
      (pTVar6->alloc1).allocBlockSize = auVar22._8_8_;
      (pTVar6->alloc1).bytesUsed = auVar22._16_8_;
      (pTVar6->alloc1).bytesWasted = auVar22._24_8_;
      (pTVar6->alloc1).ptr = (char *)auVar22._0_8_;
      (pTVar6->alloc1).cur = auVar22._8_8_;
      (pTVar6->alloc1).end = auVar22._16_8_;
      (pTVar6->alloc1).allocBlockSize = auVar22._24_8_;
    }
    else {
      (pTVar6->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar6->alloc1).ptr = (char *)auVar22._0_8_;
      (pTVar6->alloc1).cur = auVar22._8_8_;
      (pTVar6->alloc1).end = auVar22._16_8_;
      (pTVar6->alloc1).allocBlockSize = auVar22._24_8_;
      (pTVar6->alloc1).end = auVar22._0_8_;
      (pTVar6->alloc1).allocBlockSize = auVar22._8_8_;
      (pTVar6->alloc1).bytesUsed = auVar22._16_8_;
      (pTVar6->alloc1).bytesWasted = auVar22._24_8_;
      (pTVar6->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar6->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_828 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_820 = true;
    local_830 = pTVar6;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_830);
    }
    else {
      *__position._M_current = local_830;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_7a0[0] == true) {
      MutexSys::unlock(&local_7a8->mutex);
    }
  }
  pTVar6 = local_838;
  (alloc.talloc0)->bytesUsed = (long)&(local_838->mutex).mutex + (alloc.talloc0)->bytesUsed;
  sVar14 = (alloc.talloc0)->cur;
  uVar10 = (ulong)(-(int)sVar14 & 0x1f);
  uVar18 = (long)&(local_838->mutex).mutex + uVar10 + sVar14;
  (alloc.talloc0)->cur = uVar18;
  if ((alloc.talloc0)->end < uVar18) {
    (alloc.talloc0)->cur = sVar14;
    pTVar7 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
    if ((ThreadLocal2 *)((long)local_838 * 4) < pTVar7 || (long)local_838 * 4 - (long)pTVar7 == 0) {
      local_828 = pTVar7;
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
      (alloc.talloc0)->ptr = pcVar20;
      sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar14;
      (alloc.talloc0)->end = (size_t)local_828;
      (alloc.talloc0)->cur = (size_t)pTVar6;
      if (local_828 < pTVar6) {
        (alloc.talloc0)->cur = 0;
        local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
        (alloc.talloc0)->ptr = pcVar20;
        sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar14;
        (alloc.talloc0)->end = (size_t)local_828;
        (alloc.talloc0)->cur = (size_t)pTVar6;
        if (local_828 < pTVar6) {
          (alloc.talloc0)->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_012e2f93;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar14;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar10;
    pcVar20 = (alloc.talloc0)->ptr + (uVar18 - (long)local_838);
  }
LAB_012e2f93:
  pcVar20[0xc0] = '\0';
  pcVar20[0xc1] = '\0';
  pcVar20[0xc2] = -0x80;
  pcVar20[0xc3] = '\x7f';
  pcVar20[0xc4] = '\0';
  pcVar20[0xc5] = '\0';
  pcVar20[0xc6] = -0x80;
  pcVar20[199] = '\x7f';
  pcVar20[200] = '\0';
  pcVar20[0xc9] = '\0';
  pcVar20[0xca] = -0x80;
  pcVar20[0xcb] = '\x7f';
  pcVar20[0xcc] = '\0';
  pcVar20[0xcd] = '\0';
  pcVar20[0xce] = -0x80;
  pcVar20[0xcf] = '\x7f';
  pcVar20[0xd0] = '\0';
  pcVar20[0xd1] = '\0';
  pcVar20[0xd2] = -0x80;
  pcVar20[0xd3] = '\x7f';
  pcVar20[0xd4] = '\0';
  pcVar20[0xd5] = '\0';
  pcVar20[0xd6] = -0x80;
  pcVar20[0xd7] = '\x7f';
  pcVar20[0xd8] = '\0';
  pcVar20[0xd9] = '\0';
  pcVar20[0xda] = -0x80;
  pcVar20[0xdb] = '\x7f';
  pcVar20[0xdc] = '\0';
  pcVar20[0xdd] = '\0';
  pcVar20[0xde] = -0x80;
  pcVar20[0xdf] = '\x7f';
  pcVar20[0x80] = '\0';
  pcVar20[0x81] = '\0';
  pcVar20[0x82] = -0x80;
  pcVar20[0x83] = '\x7f';
  pcVar20[0x84] = '\0';
  pcVar20[0x85] = '\0';
  pcVar20[0x86] = -0x80;
  pcVar20[0x87] = '\x7f';
  pcVar20[0x88] = '\0';
  pcVar20[0x89] = '\0';
  pcVar20[0x8a] = -0x80;
  pcVar20[0x8b] = '\x7f';
  pcVar20[0x8c] = '\0';
  pcVar20[0x8d] = '\0';
  pcVar20[0x8e] = -0x80;
  pcVar20[0x8f] = '\x7f';
  pcVar20[0x90] = '\0';
  pcVar20[0x91] = '\0';
  pcVar20[0x92] = -0x80;
  pcVar20[0x93] = '\x7f';
  pcVar20[0x94] = '\0';
  pcVar20[0x95] = '\0';
  pcVar20[0x96] = -0x80;
  pcVar20[0x97] = '\x7f';
  pcVar20[0x98] = '\0';
  pcVar20[0x99] = '\0';
  pcVar20[0x9a] = -0x80;
  pcVar20[0x9b] = '\x7f';
  pcVar20[0x9c] = '\0';
  pcVar20[0x9d] = '\0';
  pcVar20[0x9e] = -0x80;
  pcVar20[0x9f] = '\x7f';
  pcVar20[0x40] = '\0';
  pcVar20[0x41] = '\0';
  pcVar20[0x42] = -0x80;
  pcVar20[0x43] = '\x7f';
  pcVar20[0x44] = '\0';
  pcVar20[0x45] = '\0';
  pcVar20[0x46] = -0x80;
  pcVar20[0x47] = '\x7f';
  pcVar20[0x48] = '\0';
  pcVar20[0x49] = '\0';
  pcVar20[0x4a] = -0x80;
  pcVar20[0x4b] = '\x7f';
  pcVar20[0x4c] = '\0';
  pcVar20[0x4d] = '\0';
  pcVar20[0x4e] = -0x80;
  pcVar20[0x4f] = '\x7f';
  pcVar20[0x50] = '\0';
  pcVar20[0x51] = '\0';
  pcVar20[0x52] = -0x80;
  pcVar20[0x53] = '\x7f';
  pcVar20[0x54] = '\0';
  pcVar20[0x55] = '\0';
  pcVar20[0x56] = -0x80;
  pcVar20[0x57] = '\x7f';
  pcVar20[0x58] = '\0';
  pcVar20[0x59] = '\0';
  pcVar20[0x5a] = -0x80;
  pcVar20[0x5b] = '\x7f';
  pcVar20[0x5c] = '\0';
  pcVar20[0x5d] = '\0';
  pcVar20[0x5e] = -0x80;
  pcVar20[0x5f] = '\x7f';
  pcVar20[0xe0] = '\0';
  pcVar20[0xe1] = '\0';
  pcVar20[0xe2] = -0x80;
  pcVar20[0xe3] = -1;
  pcVar20[0xe4] = '\0';
  pcVar20[0xe5] = '\0';
  pcVar20[0xe6] = -0x80;
  pcVar20[0xe7] = -1;
  pcVar20[0xe8] = '\0';
  pcVar20[0xe9] = '\0';
  pcVar20[0xea] = -0x80;
  pcVar20[0xeb] = -1;
  pcVar20[0xec] = '\0';
  pcVar20[0xed] = '\0';
  pcVar20[0xee] = -0x80;
  pcVar20[0xef] = -1;
  pcVar20[0xf0] = '\0';
  pcVar20[0xf1] = '\0';
  pcVar20[0xf2] = -0x80;
  pcVar20[0xf3] = -1;
  pcVar20[0xf4] = '\0';
  pcVar20[0xf5] = '\0';
  pcVar20[0xf6] = -0x80;
  pcVar20[0xf7] = -1;
  pcVar20[0xf8] = '\0';
  pcVar20[0xf9] = '\0';
  pcVar20[0xfa] = -0x80;
  pcVar20[0xfb] = -1;
  pcVar20[0xfc] = '\0';
  pcVar20[0xfd] = '\0';
  pcVar20[0xfe] = -0x80;
  pcVar20[0xff] = -1;
  pcVar20[0xa0] = '\0';
  pcVar20[0xa1] = '\0';
  pcVar20[0xa2] = -0x80;
  pcVar20[0xa3] = -1;
  pcVar20[0xa4] = '\0';
  pcVar20[0xa5] = '\0';
  pcVar20[0xa6] = -0x80;
  pcVar20[0xa7] = -1;
  pcVar20[0xa8] = '\0';
  pcVar20[0xa9] = '\0';
  pcVar20[0xaa] = -0x80;
  pcVar20[0xab] = -1;
  pcVar20[0xac] = '\0';
  pcVar20[0xad] = '\0';
  pcVar20[0xae] = -0x80;
  pcVar20[0xaf] = -1;
  pcVar20[0xb0] = '\0';
  pcVar20[0xb1] = '\0';
  pcVar20[0xb2] = -0x80;
  pcVar20[0xb3] = -1;
  pcVar20[0xb4] = '\0';
  pcVar20[0xb5] = '\0';
  pcVar20[0xb6] = -0x80;
  pcVar20[0xb7] = -1;
  pcVar20[0xb8] = '\0';
  pcVar20[0xb9] = '\0';
  pcVar20[0xba] = -0x80;
  pcVar20[0xbb] = -1;
  pcVar20[0xbc] = '\0';
  pcVar20[0xbd] = '\0';
  pcVar20[0xbe] = -0x80;
  pcVar20[0xbf] = -1;
  pcVar20[0x60] = '\0';
  pcVar20[0x61] = '\0';
  pcVar20[0x62] = -0x80;
  pcVar20[99] = -1;
  pcVar20[100] = '\0';
  pcVar20[0x65] = '\0';
  pcVar20[0x66] = -0x80;
  pcVar20[0x67] = -1;
  pcVar20[0x68] = '\0';
  pcVar20[0x69] = '\0';
  pcVar20[0x6a] = -0x80;
  pcVar20[0x6b] = -1;
  pcVar20[0x6c] = '\0';
  pcVar20[0x6d] = '\0';
  pcVar20[0x6e] = -0x80;
  pcVar20[0x6f] = -1;
  pcVar20[0x70] = '\0';
  pcVar20[0x71] = '\0';
  pcVar20[0x72] = -0x80;
  pcVar20[0x73] = -1;
  pcVar20[0x74] = '\0';
  pcVar20[0x75] = '\0';
  pcVar20[0x76] = -0x80;
  pcVar20[0x77] = -1;
  pcVar20[0x78] = '\0';
  pcVar20[0x79] = '\0';
  pcVar20[0x7a] = -0x80;
  pcVar20[0x7b] = -1;
  pcVar20[0x7c] = '\0';
  pcVar20[0x7d] = '\0';
  pcVar20[0x7e] = -0x80;
  pcVar20[0x7f] = -1;
  pcVar20[0] = '\b';
  pcVar20[1] = '\0';
  pcVar20[2] = '\0';
  pcVar20[3] = '\0';
  pcVar20[4] = '\0';
  pcVar20[5] = '\0';
  pcVar20[6] = '\0';
  pcVar20[7] = '\0';
  pcVar20[8] = '\b';
  pcVar20[9] = '\0';
  pcVar20[10] = '\0';
  pcVar20[0xb] = '\0';
  pcVar20[0xc] = '\0';
  pcVar20[0xd] = '\0';
  pcVar20[0xe] = '\0';
  pcVar20[0xf] = '\0';
  pcVar20[0x10] = '\b';
  pcVar20[0x11] = '\0';
  pcVar20[0x12] = '\0';
  pcVar20[0x13] = '\0';
  pcVar20[0x14] = '\0';
  pcVar20[0x15] = '\0';
  pcVar20[0x16] = '\0';
  pcVar20[0x17] = '\0';
  pcVar20[0x18] = '\b';
  pcVar20[0x19] = '\0';
  pcVar20[0x1a] = '\0';
  pcVar20[0x1b] = '\0';
  pcVar20[0x1c] = '\0';
  pcVar20[0x1d] = '\0';
  pcVar20[0x1e] = '\0';
  pcVar20[0x1f] = '\0';
  pcVar20[0x20] = '\b';
  pcVar20[0x21] = '\0';
  pcVar20[0x22] = '\0';
  pcVar20[0x23] = '\0';
  pcVar20[0x24] = '\0';
  pcVar20[0x25] = '\0';
  pcVar20[0x26] = '\0';
  pcVar20[0x27] = '\0';
  pcVar20[0x28] = '\b';
  pcVar20[0x29] = '\0';
  pcVar20[0x2a] = '\0';
  pcVar20[0x2b] = '\0';
  pcVar20[0x2c] = '\0';
  pcVar20[0x2d] = '\0';
  pcVar20[0x2e] = '\0';
  pcVar20[0x2f] = '\0';
  pcVar20[0x30] = '\b';
  pcVar20[0x31] = '\0';
  pcVar20[0x32] = '\0';
  pcVar20[0x33] = '\0';
  pcVar20[0x34] = '\0';
  pcVar20[0x35] = '\0';
  pcVar20[0x36] = '\0';
  pcVar20[0x37] = '\0';
  pcVar20[0x38] = '\b';
  pcVar20[0x39] = '\0';
  pcVar20[0x3a] = '\0';
  pcVar20[0x3b] = '\0';
  pcVar20[0x3c] = '\0';
  pcVar20[0x3d] = '\0';
  pcVar20[0x3e] = '\0';
  pcVar20[0x3f] = '\0';
  paVar12 = &local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
  uVar10 = 0;
  do {
    auVar3 = *(undefined1 (*) [16])paVar12[-1].m128;
    VVar4.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar12->m128;
    *(int *)(pcVar20 + uVar10 * 4 + 0x40) = auVar3._0_4_;
    uVar5 = vextractps_avx(auVar3,1);
    *(undefined4 *)(pcVar20 + uVar10 * 4 + 0x80) = uVar5;
    uVar5 = vextractps_avx(auVar3,2);
    *(undefined4 *)(pcVar20 + uVar10 * 4 + 0xc0) = uVar5;
    *(int *)(pcVar20 + uVar10 * 4 + 0x60) = VVar4.field_0._0_4_;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
    *(undefined4 *)(pcVar20 + uVar10 * 4 + 0xa0) = uVar5;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
    *(undefined4 *)(pcVar20 + uVar10 * 4 + 0xe0) = uVar5;
    uVar10 = uVar10 + 1;
    paVar12 = paVar12 + 7;
  } while (uVar21 != uVar10);
  current_00 = local_738;
  uVar10 = 0;
  do {
    NVar13 = createLargeLeaf(this,current_00,alloc);
    (&local_828)[uVar10] = (ThreadLocal2 *)NVar13.ptr;
    uVar10 = uVar10 + 1;
    current_00 = current_00 + 1;
  } while (uVar21 != uVar10);
  uVar10 = 0;
  do {
    *(ThreadLocal2 **)(pcVar20 + uVar10 * 8) = (&local_828)[uVar10];
    uVar10 = uVar10 + 1;
  } while (uVar21 != uVar10);
  return (NodeRefPtr<8>)(size_t)pcVar20;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }